

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O1

Node * __thiscall
anon_unknown.dwarf_3576a8::ParameterPack::getSyntaxNode(ParameterPack *this,OutputStream *S)

{
  int iVar1;
  undefined4 extraout_var;
  
  if (S->CurrentPackMax == 0xffffffff) {
    S->CurrentPackMax = (uint)(this->Data).NumElements;
    S->CurrentPackIndex = 0;
  }
  if ((ulong)S->CurrentPackIndex < (this->Data).NumElements) {
    iVar1 = (*(this->Data).Elements[S->CurrentPackIndex]->_vptr_Node[3])();
    return (Node *)CONCAT44(extraout_var,iVar1);
  }
  return &this->super_Node;
}

Assistant:

void initializePackExpansion(OutputStream &S) const {
    if (S.CurrentPackMax == std::numeric_limits<unsigned>::max()) {
      S.CurrentPackMax = static_cast<unsigned>(Data.size());
      S.CurrentPackIndex = 0;
    }
  }